

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void grabMouseForWidget(QWidget *widget,QCursor *cursor)

{
  QWindow *pQVar1;
  QWidget *in_RSI;
  QWidget *in_RDI;
  QWindow *window;
  
  if (qt_mouseGrb != (QWidget *)0x0) {
    QWidget::releaseMouse((QWidget *)0x381b24);
  }
  mouseGrabWithCursor = false;
  pQVar1 = grabberWindow(in_RSI);
  if (pQVar1 != (QWindow *)0x0) {
    if (in_RSI != (QWidget *)0x0) {
      mouseGrabWithCursor = true;
      QGuiApplication::setOverrideCursor((QCursor *)in_RSI);
    }
    QWindow::setMouseGrabEnabled(SUB81(pQVar1,0));
  }
  qt_mouseGrb = in_RDI;
  return;
}

Assistant:

static void grabMouseForWidget(QWidget *widget)
#endif
{
    if (qt_mouseGrb)
        qt_mouseGrb->releaseMouse();

    mouseGrabWithCursor = false;
    if (QWindow *window = grabberWindow(widget)) {
#ifndef QT_NO_CURSOR
        if (cursor) {
            mouseGrabWithCursor = true;
            QGuiApplication::setOverrideCursor(*cursor);
        }
#endif // !QT_NO_CURSOR
        window->setMouseGrabEnabled(true);
    }

    qt_mouseGrb = widget;
}